

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::MessageFormat::setFormat
          (MessageFormat *this,UnicodeString *formatName,Format *newFormat,UErrorCode *status)

{
  Part *pPVar1;
  char cVar2;
  int32_t iVar3;
  uint argStart;
  int iVar4;
  undefined4 extraout_var;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  iVar3 = MessagePattern::validateArgumentName(formatName);
  if (iVar3 < -1) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  else {
    argStart = nextTopLevelArgStart(this,0);
    if ((-1 < (int)argStart) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
      while( true ) {
        pPVar1 = (this->msgPattern).parts;
        if (pPVar1[(ulong)argStart + 1].type == UMSGPAT_PART_TYPE_ARG_NAME) {
          cVar2 = MessagePattern::partSubstringMatches
                            (&this->msgPattern,pPVar1 + (ulong)argStart + 1,formatName);
        }
        else {
          cVar2 = iVar3 == pPVar1[(ulong)argStart + 1].value;
        }
        if (cVar2 != '\0') {
          iVar4 = (*(newFormat->super_UObject)._vptr_UObject[4])(newFormat);
          if ((Format *)CONCAT44(extraout_var,iVar4) == (Format *)0x0) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            return;
          }
          setCustomArgStartFormat(this,argStart,(Format *)CONCAT44(extraout_var,iVar4),status);
        }
        argStart = nextTopLevelArgStart(this,argStart);
        if ((int)argStart < 0) break;
        if (U_ZERO_ERROR < *status) {
          return;
        }
      }
      return;
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }